

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O1

void __thiscall
MapState::addRange(MapState *this,uintb st,Datatype *ct,uint4 fl,RangeType rt,int4 hi)

{
  pointer *pppRVar1;
  int4 size;
  iterator __position;
  bool bVar2;
  AddrSpace *pAVar3;
  RangeHint *range;
  intb sst;
  RangeHint *local_48;
  Address local_40;
  
  if ((ct == (Datatype *)0x0) || (ct->size == 0)) {
    ct = this->defaultType;
  }
  size = ct->size;
  local_40.base = this->spaceid;
  local_40.offset = st;
  bVar2 = RangeList::inRange(&this->range,&local_40,size);
  if (bVar2) {
    local_40.base = (AddrSpace *)(st / this->spaceid->wordsize);
    sign_extend((intb *)&local_40,this->spaceid->addressSize * 8 + -1);
    pAVar3 = (AddrSpace *)((ulong)this->spaceid->wordsize * (long)local_40.base);
    local_40.base = pAVar3;
    local_48 = (RangeHint *)operator_new(0x30);
    local_48->start = st;
    local_48->size = size;
    local_48->sstart = (intb)pAVar3;
    local_48->type = ct;
    local_48->flags = fl;
    local_48->rangeType = rt;
    local_48->highind = hi;
    __position._M_current =
         (this->maplist).super__Vector_base<RangeHint_*,_std::allocator<RangeHint_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->maplist).super__Vector_base<RangeHint_*,_std::allocator<RangeHint_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<RangeHint*,std::allocator<RangeHint*>>::_M_realloc_insert<RangeHint*const&>
                ((vector<RangeHint*,std::allocator<RangeHint*>> *)&this->maplist,__position,
                 &local_48);
    }
    else {
      *__position._M_current = local_48;
      pppRVar1 = &(this->maplist).super__Vector_base<RangeHint_*,_std::allocator<RangeHint_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
  }
  return;
}

Assistant:

void MapState::addRange(uintb st,Datatype *ct,uint4 fl,RangeHint::RangeType rt,int4 hi)

{
  if ((ct == (Datatype *)0)||(ct->getSize()==0)) // Must have a real type
    ct = defaultType;
  int4 sz = ct->getSize();
  if (!range.inRange(Address(spaceid,st),sz))
    return;
  intb sst = (intb)AddrSpace::byteToAddress(st,spaceid->getWordSize());
  sign_extend(sst,spaceid->getAddrSize()*8-1);
  sst = (intb)AddrSpace::addressToByte(sst,spaceid->getWordSize());
  RangeHint *range = new RangeHint(st,sz,sst,ct,fl,rt,hi);
  maplist.push_back(range);
#ifdef OPACTION_DEBUG
  if (debugon) {
    ostringstream s;
    s << "Add Range: " << hex << st << ":" << dec << sz;
    s << " ";
    ct->printRaw(s);
    s << endl;
    glb->printDebug(s.str());
  }
#endif
}